

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

string * cppcms::util::urlencode(string *__return_storage_ptr__,string *s)

{
  char *b;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  b = (s->_M_dataplus)._M_p;
  urlencode_impl<std::back_insert_iterator<std::__cxx11::string>>
            (b,b + s->_M_string_length,
             (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string urlencode(std::string const &s)
{
	std::string content;
	content.reserve(3*s.size());
	std::back_insert_iterator<std::string> out(content);
	urlencode_impl(s.c_str(),s.c_str()+s.size(),out);
	return content;
}